

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall aiNode::aiNode(aiNode *this)

{
  allocator<char> local_31;
  string local_30;
  aiNode *local_10;
  aiNode *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  aiString::aiString(&this->mName,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->mTransformation);
  this->mParent = (aiNode *)0x0;
  this->mNumChildren = 0;
  this->mChildren = (aiNode **)0x0;
  this->mNumMeshes = 0;
  this->mMeshes = (uint *)0x0;
  this->mMetaData = (aiMetadata *)0x0;
  return;
}

Assistant:

aiNode::aiNode()
: mName("")
, mParent(nullptr)
, mNumChildren(0)
, mChildren(nullptr)
, mNumMeshes(0)
, mMeshes(nullptr)
, mMetaData(nullptr) {
    // empty
}